

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_buffer.cc
# Opt level: O1

int bssl::ssl_read_buffer_extend_to(SSL *ssl,size_t len)

{
  ushort uVar1;
  SSL3_STATE *pSVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int line;
  size_t new_cap;
  
  pSVar2 = ssl->s3;
  if ((pSVar2->read_buffer).size_ == 0) {
    puVar3 = (pSVar2->read_buffer).buf_;
    if (puVar3 != (pSVar2->read_buffer).inline_buf_) {
      free(puVar3);
    }
    *(undefined8 *)((long)&(pSVar2->read_buffer).buf_ + 6) = 0;
    (pSVar2->read_buffer).buf_ = (uint8_t *)0x0;
  }
  iVar5 = SSL_is_dtls(ssl);
  new_cap = 0x414d;
  if (iVar5 == 0) {
    new_cap = len;
  }
  bVar4 = SSLBuffer::EnsureCap(&ssl->s3->read_buffer,0xd,new_cap);
  uVar6 = 0xffffffff;
  if (!bVar4) {
    return 0xffffffff;
  }
  if ((ssl->rbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (bio_st *)0x0) {
    ERR_put_error(0x10,0,0x77,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_buffer.cc"
                  ,0xb9);
    return 0xffffffff;
  }
  iVar5 = SSL_is_dtls(ssl);
  pSVar2 = ssl->s3;
  if (iVar5 == 0) {
    if (new_cap <= (pSVar2->read_buffer).cap_) {
      do {
        uVar1 = (pSVar2->read_buffer).size_;
        if (new_cap <= uVar1) goto LAB_0025ccdc;
        uVar7 = BIO_read((BIO *)(ssl->rbio)._M_t.
                                super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                         (pSVar2->read_buffer).buf_ +
                         (ulong)uVar1 + (ulong)(pSVar2->read_buffer).offset_,
                         (int)new_cap - (uint)uVar1);
        if ((int)uVar7 < 1) {
          ssl->s3->rwstate = 2;
          uVar6 = uVar7;
        }
        else {
          uVar1 = (pSVar2->read_buffer).size_;
          if ((ulong)(pSVar2->read_buffer).cap_ - (ulong)uVar1 < (ulong)uVar7) goto LAB_0025cd87;
          (pSVar2->read_buffer).size_ = uVar1 + (short)uVar7;
        }
      } while (0 < (int)uVar7);
      goto LAB_0025cd4c;
    }
    iVar5 = 0x79;
    line = 0x90;
  }
  else {
    if ((pSVar2->read_buffer).size_ == 0) {
      uVar6 = BIO_read((BIO *)(ssl->rbio)._M_t.
                              super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                       (pSVar2->read_buffer).buf_ + (pSVar2->read_buffer).offset_,
                       (uint)(pSVar2->read_buffer).cap_);
      if ((int)uVar6 < 1) {
        ssl->s3->rwstate = 2;
      }
      else {
        uVar1 = (pSVar2->read_buffer).size_;
        if ((ulong)(pSVar2->read_buffer).cap_ - (ulong)uVar1 < (ulong)uVar6) {
LAB_0025cd87:
          abort();
        }
        (pSVar2->read_buffer).size_ = uVar1 + (short)uVar6;
LAB_0025ccdc:
        uVar6 = 1;
      }
      goto LAB_0025cd4c;
    }
    iVar5 = 0x44;
    line = 0x7d;
  }
  ERR_put_error(0x10,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_buffer.cc"
                ,line);
  uVar6 = 0xffffffff;
LAB_0025cd4c:
  if (((int)uVar6 < 1) && (pSVar2 = ssl->s3, (pSVar2->read_buffer).size_ == 0)) {
    puVar3 = (pSVar2->read_buffer).buf_;
    if (puVar3 != (pSVar2->read_buffer).inline_buf_) {
      free(puVar3);
    }
    *(undefined8 *)((long)&(pSVar2->read_buffer).buf_ + 6) = 0;
    (pSVar2->read_buffer).buf_ = (uint8_t *)0x0;
  }
  return uVar6;
}

Assistant:

int ssl_read_buffer_extend_to(SSL *ssl, size_t len) {
  // |ssl_read_buffer_extend_to| implicitly discards any consumed data.
  ssl->s3->read_buffer.DiscardConsumed();

  if (SSL_is_dtls(ssl)) {
    static_assert(
        DTLS1_RT_MAX_HEADER_LENGTH + SSL3_RT_MAX_ENCRYPTED_LENGTH <= 0xffff,
        "DTLS read buffer is too large");

    // The |len| parameter is ignored in DTLS.
    len = DTLS1_RT_MAX_HEADER_LENGTH + SSL3_RT_MAX_ENCRYPTED_LENGTH;
  }

  // The DTLS record header can have a variable length, so the |header_len|
  // value provided for buffer alignment only works if the header is the maximum
  // length.
  if (!ssl->s3->read_buffer.EnsureCap(DTLS1_RT_MAX_HEADER_LENGTH, len)) {
    return -1;
  }

  if (ssl->rbio == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BIO_NOT_SET);
    return -1;
  }

  int ret;
  if (SSL_is_dtls(ssl)) {
    // |len| is ignored for a datagram transport.
    ret = dtls_read_buffer_next_packet(ssl);
  } else {
    ret = tls_read_buffer_extend_to(ssl, len);
  }

  if (ret <= 0) {
    // If the buffer was empty originally and remained empty after attempting to
    // extend it, release the buffer until the next attempt.
    ssl->s3->read_buffer.DiscardConsumed();
  }
  return ret;
}